

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

void __thiscall QBoxLayout::addItem(QBoxLayout *this,QLayoutItem *item)

{
  long lVar1;
  QPodArrayOps<QBoxLayoutItem*> *this_00;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  local_28 = (QBoxLayoutItem *)operator_new(0x10);
  local_28->item = item;
  local_28->stretch = 0;
  local_28->magic = false;
  this_00 = (QPodArrayOps<QBoxLayoutItem*> *)(lVar1 + 0xb0);
  QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
            (this_00,*(qsizetype *)(lVar1 + 0xc0),&local_28);
  QList<QBoxLayoutItem_*>::end((QList<QBoxLayoutItem_*> *)this_00);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::addItem(QLayoutItem *item)
{
    Q_D(QBoxLayout);
    QBoxLayoutItem *it = new QBoxLayoutItem(item);
    d->list.append(it);
    invalidate();
}